

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_kernel_c.h
# Opt level: O0

range * __thiscall
dlib::
map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
::operator[](map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
             *this,domain *d)

{
  bool bVar1;
  ostream *poVar2;
  ostream *poVar3;
  string *a;
  undefined8 uVar4;
  unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_> *puVar5;
  void *in_RDI;
  ostringstream dlib_o_out;
  unsigned_long *in_stack_fffffffffffffdb8;
  map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_stack_fffffffffffffdc0;
  error_type t;
  ostream local_188;
  
  bVar1 = map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
          ::is_in_domain(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  if (!bVar1) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
    poVar2 = std::operator<<(&local_188,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xd8);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<(&local_188,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/bsp/../sockets/../threads/../map/map_kernel_c.h"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<(&local_188,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "typename map_base::range_type &dlib::map_kernel_c<dlib::map_kernel_1<unsigned long, std::unique_ptr<dlib::impl1::bsp_con>, dlib::binary_search_tree_kernel_1<unsigned long, std::unique_ptr<dlib::impl1::bsp_con>, dlib::memory_manager_stateless_kernel_1<char>>>>::operator[](const domain &) [map_base = dlib::map_kernel_1<unsigned long, std::unique_ptr<dlib::impl1::bsp_con>, dlib::binary_search_tree_kernel_1<unsigned long, std::unique_ptr<dlib::impl1::bsp_con>, dlib::memory_manager_stateless_kernel_1<char>>>]"
                            );
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<(&local_188,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"this->is_in_domain(d)");
    std::operator<<(poVar2,".\n");
    poVar2 = (ostream *)std::ostream::operator<<(&local_188,std::boolalpha);
    poVar2 = std::operator<<(poVar2,"\trange& map::operator[]");
    poVar3 = std::operator<<(poVar2,"\n\td must be in the domain of the map");
    a = (string *)std::operator<<(poVar3,"\n\tthis: ");
    t = (error_type)((ulong)poVar3 >> 0x20);
    poVar3 = (ostream *)std::ostream::operator<<(a,in_RDI);
    std::operator<<(poVar3,"\n");
    uVar4 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error((fatal_error *)poVar2,t,a);
    __cxa_throw(uVar4,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  puVar5 = map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
           ::operator[](in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  return puVar5;
}

Assistant:

typename map_base::range_type& map_kernel_c<map_base>::
    operator[] (
        const domain& d
    )
    {
        // make sure requires clause is not broken
        DLIB_CASSERT( this->is_in_domain(d),
            "\trange& map::operator[]"
            << "\n\td must be in the domain of the map"
            << "\n\tthis: " << this
            );

        // call the real function
        return map_base::operator[](d);
    }